

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::GetChannelMask
          (Error *__return_storage_ptr__,CommissionerApp *this,ChannelMask *aChannelMask)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string sStack_a8;
  writer write;
  undefined1 local_80 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "the commissioner is not active";
    local_58.context_.types_ = local_58.types_;
    while (pcVar4 = pcVar3, pcVar4 != "") {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_58);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_(&sStack_a8,(v10 *)0x2157e0,(string_view)ZEXT816(0x1e),args);
    local_80._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&sStack_a8);
  }
  else {
    if (((this->mActiveDataset).mPresentFlags & 0x2000) != 0) {
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::operator=(aChannelMask,&(this->mActiveDataset).mChannelMask);
      return __return_storage_ptr__;
    }
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find valid Channel Masks in Active Operational Dataset";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x3d;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "cannot find valid Channel Masks in Active Operational Dataset";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar3,"");
          goto LAB_00188700;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_58);
    }
LAB_00188700:
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&sStack_a8,(v10 *)"cannot find valid Channel Masks in Active Operational Dataset",
               (string_view)ZEXT816(0x3d),args_00);
    local_80._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&sStack_a8);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&sStack_a8);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetChannelMask(ChannelMask &aChannelMask) const
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit,
                 error = ERROR_NOT_FOUND("cannot find valid Channel Masks in Active Operational Dataset"));
    aChannelMask = mActiveDataset.mChannelMask;

exit:
    return error;
}